

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypesC.cpp
# Opt level: O0

void SoapySDRArgInfo_clear(SoapySDRArgInfo *info)

{
  undefined8 *in_RDI;
  
  SoapySDR_free((void *)0x16b141);
  *in_RDI = 0;
  SoapySDR_free((void *)0x16b159);
  in_RDI[1] = 0;
  SoapySDR_free((void *)0x16b172);
  in_RDI[2] = 0;
  SoapySDR_free((void *)0x16b18b);
  in_RDI[3] = 0;
  SoapySDR_free((void *)0x16b1a4);
  in_RDI[4] = 0;
  SoapySDRStrings_clear((char ***)info,(size_t)in_RDI);
  SoapySDRStrings_clear((char ***)info,(size_t)in_RDI);
  in_RDI[9] = 0;
  return;
}

Assistant:

void SoapySDRArgInfo_clear(SoapySDRArgInfo *info)
{
    //clear strings
    SoapySDR_free(info->key);
    info->key = NULL;

    SoapySDR_free(info->value);
    info->value = NULL;

    SoapySDR_free(info->name);
    info->name = NULL;

    SoapySDR_free(info->description);
    info->description = NULL;

    SoapySDR_free(info->units);
    info->units = NULL;

    //clear options
    SoapySDRStrings_clear(&info->options, info->numOptions);
    SoapySDRStrings_clear(&info->optionNames, info->numOptions);
    info->numOptions = 0;
}